

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSC32.cpp
# Opt level: O0

void * SSC32Thread(void *pParam)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  double dVar4;
  double dVar5;
  double local_ce0;
  double local_cd0;
  double local_cc0;
  char local_c88 [8];
  char szTemp [256];
  char szSaveFilePath [256];
  int local_a7c;
  int local_a78;
  int i;
  int errcount;
  int threadperiod;
  CHRONO chrono_period;
  BOOL bConnected;
  BOOL bRudderChecked;
  double thrust2;
  double thrust1;
  double flux;
  double thrust;
  double rudder;
  SSC32 ssc32;
  void *pParam_local;
  
  chrono_period._68_4_ = 0;
  chrono_period.Suspended = 0;
  i = 0x32;
  local_a78 = 0;
  ssc32.MaxAngle = (double)pParam;
  memset(&rudder,0,0x9e8);
  StartChrono((CHRONO *)&errcount);
  do {
    while( true ) {
      StopChronoQuick((CHRONO *)&errcount);
      StartChrono((CHRONO *)&errcount);
      mSleep((long)i);
      if (bPauseSSC32 == 0) break;
      if (chrono_period.Suspended != 0) {
        printf("SSC32 paused.\n");
        chrono_period.Suspended = 0;
        DisconnectSSC32((SSC32 *)&rudder);
      }
      if (bExit != 0) goto LAB_001a91ca;
      mSleep(100);
    }
    if (bRestartSSC32 != 0) {
      if (chrono_period.Suspended != 0) {
        printf("Restarting a SSC32.\n");
        chrono_period.Suspended = 0;
        DisconnectSSC32((SSC32 *)&rudder);
      }
      bRestartSSC32 = 0;
    }
    if (chrono_period.Suspended == 0) {
      iVar1 = ConnectSSC32((SSC32 *)&rudder,"SSC320.txt");
      if (iVar1 == 0) {
        chrono_period.Suspended = 1;
        i = ssc32.BaudRate;
        if (ssc32.RS232Port._784_8_ != 0) {
          fclose((FILE *)ssc32.RS232Port._784_8_);
          ssc32.RS232Port.DevType = 0;
          ssc32.RS232Port._788_4_ = 0;
        }
        if ((ssc32.timeout != 0) && (ssc32.RS232Port._784_8_ == 0)) {
          sVar2 = strlen((char *)(ssc32.LastPWs + 0x1e));
          if (sVar2 == 0) {
            sprintf(local_c88,"ssc32");
          }
          else {
            sprintf(local_c88,"%.127s",ssc32.LastPWs + 0x1e);
          }
          sVar2 = strlen(local_c88);
          local_a7c = (int)sVar2;
          do {
            local_a7c = local_a7c + -1;
            if (local_a7c < 0) break;
          } while (local_c88[local_a7c] != '.');
          if ((0 < local_a7c) && (sVar2 = strlen(local_c88), local_a7c < (int)sVar2)) {
            sVar2 = strlen(local_c88);
            memset(local_c88 + local_a7c,0,sVar2 - (long)local_a7c);
          }
          EnterCriticalSection(&strtimeCS);
          pcVar3 = strtimeex_fns();
          sprintf(szTemp + 0xf8,"log/%.127s_%.64s.txt",local_c88,pcVar3);
          LeaveCriticalSection(&strtimeCS);
          ssc32.RS232Port._784_8_ = fopen(szTemp + 0xf8,"wb");
          if ((FILE *)ssc32.RS232Port._784_8_ == (FILE *)0x0) {
            printf("Unable to create SSC32 data file.\n");
            break;
          }
        }
      }
      else {
        chrono_period.Suspended = 0;
        mSleep(1000);
      }
    }
    else if (robid == 0x200) {
LAB_001a90ea:
      EnterCriticalSection(&StateVariablesCS);
      dVar4 = u2;
      dVar5 = u1;
      LeaveCriticalSection(&StateVariablesCS);
      iVar1 = SetThrustersSSC32((SSC32 *)&rudder,dVar5,dVar4);
      if (iVar1 != 0) {
        printf("Connection to a SSC32 lost.\n");
        chrono_period.Suspended = 0;
        DisconnectSSC32((SSC32 *)&rudder);
      }
    }
    else if (robid == 0x400) {
      EnterCriticalSection(&StateVariablesCS);
      rudderminangle = (double)ssc32._2504_8_;
      ruddermidangle = ssc32.MinAngle;
      ruddermaxangle = ssc32.MidAngle;
      dVar5 = -uw_f;
      local_ce0 = ssc32.MidAngle;
      if (ABS(ssc32.MidAngle) < ABS((double)ssc32._2504_8_)) {
        local_ce0 = (double)ssc32._2504_8_;
      }
      local_ce0 = ABS(local_ce0);
      if (bEnableFluxMotorboat == 0) {
        flux = u_f;
        if ((bEnableBackwardsMotorboat == 0) && (u_f < 0.0)) {
          flux = 0.0;
        }
        LeaveCriticalSection(&StateVariablesCS);
        iVar1 = SetRudderThrusterSSC32((SSC32 *)&rudder,dVar5 * local_ce0,flux);
        if (iVar1 != 0) {
          printf("Connection to a SSC32 lost.\n");
          chrono_period.Suspended = 0;
          DisconnectSSC32((SSC32 *)&rudder);
        }
      }
      else {
        flux = ABS(u_f);
        if (bEnableBackwardsMotorboat == 0) {
          if (u_f < 0.0) {
            flux = 0.0;
          }
          thrust1 = 1.0;
        }
        else if (0.0 <= u_f) {
          thrust1 = 1.0;
        }
        else {
          thrust1 = -1.0;
        }
        LeaveCriticalSection(&StateVariablesCS);
        iVar1 = SetRudderThrustersFluxSSC32
                          ((SSC32 *)&rudder,dVar5 * local_ce0,flux,flux,thrust1,thrust1);
        if (iVar1 != 0) {
          printf("Connection to a SSC32 lost.\n");
          chrono_period.Suspended = 0;
          DisconnectSSC32((SSC32 *)&rudder);
        }
      }
    }
    else if (robid == 0x2000) {
      if ((bCheckRudder != 0) && (chrono_period._68_4_ == 0)) {
        iVar1 = CheckRudderSSC32((SSC32 *)&rudder);
        if (iVar1 != 0) {
          printf("Connection to a SSC32 lost.\n");
          chrono_period.Suspended = 0;
          DisconnectSSC32((SSC32 *)&rudder);
          goto LAB_001a9173;
        }
        chrono_period._68_4_ = 1;
      }
      EnterCriticalSection(&StateVariablesCS);
      rudderminangle = (double)ssc32._2504_8_;
      ruddermidangle = ssc32.MinAngle;
      ruddermaxangle = ssc32.MidAngle;
      dVar5 = -uw_f;
      local_cd0 = ssc32.MidAngle;
      if (ABS(ssc32.MidAngle) < ABS((double)ssc32._2504_8_)) {
        local_cd0 = (double)ssc32._2504_8_;
      }
      local_cd0 = ABS(local_cd0);
      LeaveCriticalSection(&StateVariablesCS);
      iVar1 = SetRudderSSC32((SSC32 *)&rudder,dVar5 * local_cd0);
      if (iVar1 != 0) {
        printf("Connection to a SSC32 lost.\n");
        chrono_period.Suspended = 0;
        DisconnectSSC32((SSC32 *)&rudder);
      }
    }
    else {
      if (((robid != 0x4000) && (robid != 0x8000)) && ((robid == 0x20000 || (robid != 0x200000))))
      goto LAB_001a90ea;
      EnterCriticalSection(&StateVariablesCS);
      dVar5 = u_f;
      rudderminangle = (double)ssc32._2504_8_;
      ruddermidangle = ssc32.MinAngle;
      ruddermaxangle = ssc32.MidAngle;
      dVar4 = -uw_f;
      local_cc0 = ssc32.MidAngle;
      if (ABS(ssc32.MidAngle) < ABS((double)ssc32._2504_8_)) {
        local_cc0 = (double)ssc32._2504_8_;
      }
      local_cc0 = ABS(local_cc0);
      LeaveCriticalSection(&StateVariablesCS);
      iVar1 = SetRudderThrusterSSC32((SSC32 *)&rudder,dVar4 * local_cc0,dVar5);
      if (iVar1 != 0) {
        printf("Connection to a SSC32 lost.\n");
        chrono_period.Suspended = 0;
        DisconnectSSC32((SSC32 *)&rudder);
      }
    }
LAB_001a9173:
    if (((chrono_period.Suspended == 0) && (local_a78 = local_a78 + 1, 0 < ExitOnErrorCount)) &&
       (ExitOnErrorCount <= local_a78)) {
      bExit = 1;
    }
  } while (bExit == 0);
LAB_001a91ca:
  if (robid != 0x200) {
    if (robid == 0x400) {
      if (bEnableFluxMotorboat == 0) {
        SetRudderThrusterSSC32((SSC32 *)&rudder,0.0,0.0);
      }
      else {
        SetRudderThrustersFluxSSC32((SSC32 *)&rudder,0.0,0.0,0.0,0.0,0.0);
      }
      mSleep((long)i);
      goto LAB_001a92d8;
    }
    if (((robid == 0x2000) || (robid == 0x4000)) || (robid == 0x8000)) goto LAB_001a92d8;
    if ((robid != 0x20000) && (robid == 0x200000)) {
      SetRudderThrustersFluxSSC32((SSC32 *)&rudder,0.0,0.0,0.0,0.0,0.0);
      mSleep((long)i);
      goto LAB_001a92d8;
    }
  }
  SetThrustersSSC32((SSC32 *)&rudder,0.0,0.0);
  mSleep((long)i);
LAB_001a92d8:
  StopChronoQuick((CHRONO *)&errcount);
  if (ssc32.RS232Port._784_8_ != 0) {
    fclose((FILE *)ssc32.RS232Port._784_8_);
    ssc32.RS232Port.DevType = 0;
    ssc32.RS232Port._788_4_ = 0;
  }
  if (chrono_period.Suspended != 0) {
    DisconnectSSC32((SSC32 *)&rudder);
  }
  if (bExit == 0) {
    bExit = 1;
  }
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE SSC32Thread(void* pParam)
{
	SSC32 ssc32;
	double rudder = 0, thrust = 0, flux = 0;
	double thrust1 = 0, thrust2 = 0;
	BOOL bRudderChecked = FALSE;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 50;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&ssc32, 0, sizeof(SSC32));

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		mSleep(threadperiod);

		if (bPauseSSC32) 
		{
			if (bConnected)
			{
				printf("SSC32 paused.\n");
				bConnected = FALSE;
				DisconnectSSC32(&ssc32);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartSSC32) 
		{
			if (bConnected)
			{
				printf("Restarting a SSC32.\n");
				bConnected = FALSE;
				DisconnectSSC32(&ssc32);
			}
			bRestartSSC32 = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectSSC32(&ssc32, "SSC320.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = ssc32.threadperiod;

				if (ssc32.pfSaveFile != NULL)
				{
					fclose(ssc32.pfSaveFile); 
					ssc32.pfSaveFile = NULL;
				}
				if ((ssc32.bSaveRawData)&&(ssc32.pfSaveFile == NULL)) 
				{
					if (strlen(ssc32.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", ssc32.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "ssc32");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.txt", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					ssc32.pfSaveFile = fopen(szSaveFilePath, "wb");
					if (ssc32.pfSaveFile == NULL) 
					{
						printf("Unable to create SSC32 data file.\n");
						break;
					}
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			switch (robid)
			{
			case BUGGY_ROBID:
			case SAILBOAT_ROBID:
			case SAILBOAT2_ROBID:
				EnterCriticalSection(&StateVariablesCS);
				rudderminangle = ssc32.MinAngle; ruddermidangle = ssc32.MidAngle; ruddermaxangle = ssc32.MaxAngle;
				rudder = -uw_f*max(fabs(ssc32.MinAngle), fabs(ssc32.MaxAngle));
				thrust = u_f;
				LeaveCriticalSection(&StateVariablesCS);
				if (SetRudderThrusterSSC32(&ssc32, rudder, thrust) != EXIT_SUCCESS)
				{
					printf("Connection to a SSC32 lost.\n");
					bConnected = FALSE;
					DisconnectSSC32(&ssc32);
					break;
				}
				break;
			case VAIMOS_ROBID:
				if ((bCheckRudder)&&(!bRudderChecked))
				{
					if (CheckRudderSSC32(&ssc32) != EXIT_SUCCESS)
					{
						printf("Connection to a SSC32 lost.\n");
						bConnected = FALSE;
						DisconnectSSC32(&ssc32);
						break;
					}
					bRudderChecked = TRUE;
				}
				EnterCriticalSection(&StateVariablesCS);
				rudderminangle = ssc32.MinAngle; ruddermidangle = ssc32.MidAngle; ruddermaxangle = ssc32.MaxAngle;
				rudder = -uw_f*max(fabs(ssc32.MinAngle), fabs(ssc32.MaxAngle));
				LeaveCriticalSection(&StateVariablesCS);
				if (SetRudderSSC32(&ssc32, rudder) != EXIT_SUCCESS)
				{
					printf("Connection to a SSC32 lost.\n");
					bConnected = FALSE;
					DisconnectSSC32(&ssc32);
					break;
				}
				break;
			case MOTORBOAT_ROBID:
				EnterCriticalSection(&StateVariablesCS);
				rudderminangle = ssc32.MinAngle; ruddermidangle = ssc32.MidAngle; ruddermaxangle = ssc32.MaxAngle;
				rudder = -uw_f*max(fabs(ssc32.MinAngle), fabs(ssc32.MaxAngle));
				if (bEnableFluxMotorboat)
				{
				thrust = fabs(u_f);
				if (bEnableBackwardsMotorboat)
				{
					if (u_f < 0) flux = -1; else flux = 1;
				}
				else
				{
					if (u_f < 0) thrust = 0;
					flux = 1;
				}
				LeaveCriticalSection(&StateVariablesCS);
				if (SetRudderThrustersFluxSSC32(&ssc32, rudder, thrust, thrust, flux, flux) != EXIT_SUCCESS)
				{
					printf("Connection to a SSC32 lost.\n");
					bConnected = FALSE;
					DisconnectSSC32(&ssc32);
					break;
				}
				}
				else
				{
				thrust = u_f;
				if (!bEnableBackwardsMotorboat)
				{
					if (u_f < 0) thrust = 0;
				}
				LeaveCriticalSection(&StateVariablesCS);
				if (SetRudderThrusterSSC32(&ssc32, rudder, thrust) != EXIT_SUCCESS)
				{
					printf("Connection to a SSC32 lost.\n");
					bConnected = FALSE;
					DisconnectSSC32(&ssc32);
					break;
				}
				}
				break;
			case BUBBLE_ROBID:
			case ETAS_WHEEL_ROBID:
			default:
				EnterCriticalSection(&StateVariablesCS);
				thrust1 = u1;
				thrust2 = u2;
				LeaveCriticalSection(&StateVariablesCS);
				if (SetThrustersSSC32(&ssc32, thrust1, thrust2) != EXIT_SUCCESS)
				{
					printf("Connection to a SSC32 lost.\n");
					bConnected = FALSE;
					DisconnectSSC32(&ssc32);
					break;
				}
				break;
			}
		}

		//printf("SSC32Thread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	switch (robid)
	{
	case BUGGY_ROBID:
		SetRudderThrustersFluxSSC32(&ssc32, 0, 0, 0, 0, 0);
		mSleep(threadperiod);
		break;
	case SAILBOAT_ROBID:
	case SAILBOAT2_ROBID:
	case VAIMOS_ROBID:
		break;
	case MOTORBOAT_ROBID:
		if (bEnableFluxMotorboat) SetRudderThrustersFluxSSC32(&ssc32, 0, 0, 0, 0, 0); else SetRudderThrusterSSC32(&ssc32, 0, 0);
		mSleep(threadperiod);
		break;
	case BUBBLE_ROBID:
	case ETAS_WHEEL_ROBID:
	default:
		SetThrustersSSC32(&ssc32, 0, 0);
		mSleep(threadperiod);
		break;
	}

	StopChronoQuick(&chrono_period);

	if (ssc32.pfSaveFile != NULL)
	{
		fclose(ssc32.pfSaveFile); 
		ssc32.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectSSC32(&ssc32);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}